

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

int Lodtalk::executeScriptFromFile
              (InterpreterProxy *interpreter,FILE *file,string *name,string *basePath)

{
  int iVar1;
  undefined4 extraout_var;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Oop oop;
  ScriptContext *pSVar3;
  Node *pNVar4;
  shared_ptr<Lodtalk::GlobalEvaluationScope> scope;
  VMContext *vmContext;
  __shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Ref<Lodtalk::ScriptContext> context;
  ASTInterpreter astInterpreter;
  VMContext *this;
  
  iVar1 = (**interpreter->_vptr_InterpreterProxy)();
  this = (VMContext *)CONCAT44(extraout_var,iVar1);
  aVar2.header = VMContext::basicNativeNewFromClassIndex(this,0x62);
  OopRef::OopRef(&context.reference,this);
  context.reference.oop.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)(anon_union_8_4_0eb573b0_for_Oop_0)aVar2.header;
  if ((ObjectHeader *)aVar2.pointer == (ObjectHeader *)&NilObject) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  }
  else {
    oop = VMContext::getGlobalContext(this);
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getClassFromOop(this,oop);
    pSVar3 = Ref<Lodtalk::ScriptContext>::operator->(&context);
    (pSVar3->globalContextClass).field_0 = aVar2;
    aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteString(this,basePath);
    pSVar3 = Ref<Lodtalk::ScriptContext>::operator->(&context);
    (pSVar3->basePath).field_0 = aVar2;
    pNVar4 = AST::parseSourceFromFile(this,file);
    if (pNVar4 == (Node *)0x0) {
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    }
    else {
      std::make_shared<Lodtalk::GlobalEvaluationScope,Lodtalk::VMContext*&>((VMContext **)&scope);
      std::__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Lodtalk::GlobalEvaluationScope,void>
                (local_a8,&scope.
                           super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>
                );
      ASTInterpreter::ASTInterpreter
                (&astInterpreter,interpreter,(EvaluationScopePtr *)local_a8,context.reference.oop);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
      (*pNVar4->_vptr_Node[2])(pNVar4,&astInterpreter);
      ASTInterpreter::~ASTInterpreter(&astInterpreter);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&scope.
                  super___shared_ptr<Lodtalk::GlobalEvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      iVar1 = 0;
    }
  }
  OopRef::~OopRef(&context.reference);
  return iVar1;
}

Assistant:

int executeScriptFromFile(InterpreterProxy *interpreter, FILE *file, const std::string &name, const std::string &basePath)
{
    // Create the script context
    auto vmContext = interpreter->getContext();
	Ref<ScriptContext> context(vmContext, reinterpret_cast<ScriptContext*> (vmContext->basicNativeNewFromClassIndex(SCI_ScriptContext)));
	if(context.isNil())
		return interpreter->primitiveFailed();

	context->globalContextClass = vmContext->getClassFromOop(vmContext->getGlobalContext());
	context->basePath = vmContext->makeByteString(basePath);

	// Parse the script.
	auto ast = Lodtalk::AST::parseSourceFromFile(vmContext, file);
	if(!ast)
		return interpreter->primitiveFailed();

	// Create the global scope
	auto scope = std::make_shared<GlobalEvaluationScope> (vmContext);

	// Interpret the script.
	ASTInterpreter astInterpreter(interpreter, scope, context.getOop());
	ast->acceptVisitor(&astInterpreter);

    return 0;
}